

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test10::verifyResults
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex)

{
  pointer puVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  uint uVar4;
  GLuint GVar5;
  deUint32 dVar6;
  _variable_type _Var7;
  GLuint GVar8;
  GLuint GVar9;
  undefined4 extraout_var;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  GPUShaderFP64Test10 *this_00;
  uint uVar15;
  GLuint GVar16;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar10;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  uVar4 = (*function_object->_vptr_functionObject[5])(function_object);
  GVar5 = functionObject::getResultStride(function_object);
  puVar1 = (this->m_expected_results_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (**(code **)(lVar10 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba2);
  lVar11 = (**(code **)(lVar10 + 0xcf8))(0x8c8e,35000);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba5);
  bVar2 = true;
  if (uVar4 != 0) {
    uVar15 = 0;
    do {
      this_00 = (GPUShaderFP64Test10 *)function_object;
      _Var7 = (*function_object->_vptr_functionObject[6])(function_object,(ulong)uVar15);
      if (uVar15 == 0) {
        uVar13 = 0;
      }
      else {
        GVar16 = 0;
        uVar14 = 0;
        do {
          this_00 = (GPUShaderFP64Test10 *)function_object;
          GVar8 = functionObject::getResultStride(function_object,GVar16);
          uVar14 = uVar14 + GVar8;
          GVar16 = GVar16 + 1;
        } while (uVar15 != GVar16);
        uVar13 = (ulong)uVar14;
      }
      bVar2 = compare(this_00,_Var7,puVar1 + uVar13 + GVar5 * vertex,(GLvoid *)(uVar13 + lVar11));
      if (!bVar2) {
        bVar2 = false;
        break;
      }
      uVar15 = uVar15 + 1;
      bVar2 = true;
    } while (uVar15 != uVar4);
  }
  (**(code **)(lVar10 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3bb8);
  if (bVar2 == false) {
    GVar16 = functionObject::getArgumentStride(function_object);
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Error. Invalid result.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Function: ",10);
    __s = function_object->m_function_name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar12 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar12);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (uVar4 != 0) {
      uVar15 = 0;
      do {
        _Var7 = (*function_object->_vptr_functionObject[6])(function_object);
        if (uVar15 == 0) {
          uVar13 = 0;
        }
        else {
          GVar8 = 0;
          uVar14 = 0;
          do {
            GVar9 = functionObject::getResultStride(function_object,GVar8);
            uVar14 = uVar14 + GVar9;
            GVar8 = GVar8 + 1;
          } while (uVar15 != GVar8);
          uVar13 = (ulong)uVar14;
        }
        logVariableType(this,(GLvoid *)(uVar13 + lVar11),"Result",_Var7);
        logVariableType(this,puVar1 + uVar13 + GVar5 * vertex,"Expected result",_Var7);
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar4);
    }
    iVar3 = (*function_object->_vptr_functionObject[3])(function_object);
    if (iVar3 != 0) {
      uVar4 = 0;
      do {
        iVar3 = 0;
        if (uVar4 != 0) {
          GVar5 = 0;
          iVar3 = 0;
          do {
            GVar8 = functionObject::getArgumentStride(function_object,GVar5);
            iVar3 = iVar3 + GVar8;
            GVar5 = GVar5 + 1;
          } while (uVar4 != GVar5);
        }
        puVar1 = (this->m_argument_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var7 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)uVar4);
        logVariableType(this,puVar1 + (iVar3 + GVar16 * vertex),"Argument",_Var7);
        uVar4 = uVar4 + 1;
        uVar15 = (*function_object->_vptr_functionObject[3])(function_object);
      } while (uVar4 < uVar15);
    }
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Shader:\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(this->m_vertex_shader_code)._M_dataplus._M_p,
               (this->m_vertex_shader_code)._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar2;
}

Assistant:

bool GPUShaderFP64Test10::verifyResults(const functionObject& function_object, glw::GLuint vertex)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  test_result	  = true;
	const glw::GLuint	 n_results		   = function_object.getResultCount();
	const glw::GLuint	 results_stride   = function_object.getResultStride();
	const glw::GLuint	 results_offset   = vertex * results_stride;
	const glw::GLubyte*   expected_results = &m_expected_results_data[results_offset];

	/* Get transform feedback data */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	glw::GLubyte* feedback_data = (glw::GLubyte*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		const Utils::_variable_type result_type   = function_object.getResultType(result);
		const glw::GLuint			result_offset = function_object.getResultOffset(result);

		const glw::GLvoid* expected_result_src = expected_results + result_offset;
		const glw::GLvoid* result_src		   = feedback_data + result_offset;

		if (false == compare(result_type, expected_result_src, result_src))
		{
			test_result = false;
			break;
		}
	}

	/* Unmap transform feedback buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	if (false == test_result)
	{
		const glw::GLuint argument_stride  = function_object.getArgumentStride();
		const glw::GLuint arguments_offset = vertex * argument_stride;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function: " << function_object.getName()
											<< tcu::TestLog::EndMessage;

		for (glw::GLuint result = 0; result < n_results; ++result)
		{
			const Utils::_variable_type result_type   = function_object.getResultType(result);
			const glw::GLuint			result_offset = function_object.getResultOffset(result);

			const glw::GLvoid* expected_result_src = expected_results + result_offset;
			const glw::GLvoid* result_src		   = feedback_data + result_offset;

			logVariableType(result_src, "Result", result_type);
			logVariableType(expected_result_src, "Expected result", result_type);
		}

		for (glw::GLuint argument = 0; argument < function_object.getArgumentCount(); ++argument)
		{
			const glw::GLuint   argument_offset = function_object.getArgumentOffset(argument);
			const glw::GLubyte* argument_src	= &m_argument_data[arguments_offset + argument_offset];

			logVariableType(argument_src, "Argument", function_object.getArgumentType(argument));
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader:\n"
											<< m_vertex_shader_code << tcu::TestLog::EndMessage;
	}

	return test_result;
}